

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

ssize_t __thiscall
FIX::HttpConnection::read(HttpConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t len;
  SocketRecvFailed *pSVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  SocketRecvFailed *anon_var_0;
  ssize_t size;
  socket_handle local_24;
  int result;
  pollfd pfd;
  int timeout;
  HttpConnection *this_local;
  
  pfd.fd = 2000;
  local_24 = this->m_socket;
  result._0_2_ = 3;
  result._2_2_ = 0;
  unique0x10000152 = this;
  iVar1 = poll((pollfd *)&stack0xffffffffffffffdc,1,2000);
  if (iVar1 < 1) {
    if (iVar1 == 0) {
      disconnect(this,0x198);
      this_local._7_1_ = 0;
      uVar3 = extraout_RAX;
      goto LAB_00250147;
    }
    if (iVar1 < 0) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,(long)iVar1);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,SocketRecvFailed::~SocketRecvFailed);
    }
  }
  else {
    len = socket_recv(this->m_socket,this->m_buffer,0x2000);
    if ((long)len < 1) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,len);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,SocketRecvFailed::~SocketRecvFailed);
    }
    HttpParser::addToStream(&this->m_parser,this->m_buffer,len);
  }
  processStream(this);
  this_local._7_1_ = 1;
  uVar3 = extraout_RAX_00;
LAB_00250147:
  return CONCAT71((int7)((ulong)uVar3 >> 8),this_local._7_1_);
}

Assistant:

bool HttpConnection::read() {
#if _MSC_VER
  struct timeval timeout = {2, 0};
  fd_set readset = m_fds;
#else
  int timeout = 2000; // 2000ms = 2 seconds
  struct pollfd pfd = {m_socket, POLLIN | POLLPRI, 0};
#endif

  try {
#if _MSC_VER
    // Wait for input (1 second timeout)
    int result = select(0, &readset, 0, 0, &timeout);
#else
    // Wait for input (2 second timeout)
    int result = poll(&pfd, 1, timeout);
#endif

    if (result > 0) // Something to read
    {
      // We can read without blocking
      ssize_t size = socket_recv(m_socket, m_buffer, sizeof(m_buffer));
      if (size <= 0) {
        throw SocketRecvFailed(size);
      }
      m_parser.addToStream(m_buffer, size);
    } else if (result == 0) // Timeout
    {
      disconnect(408);
      return false;
    } else if (result < 0) // Error
    {
      throw SocketRecvFailed(result);
    }

    processStream();
    return true;
  } catch (SocketRecvFailed &) {
    disconnect();
    return false;
  }
}